

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

uint16_t gravity_function_cpool_add(gravity_vm *vm,gravity_function_t *f,gravity_value_t v)

{
  _Bool _Var1;
  void *pvVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 obj;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  gravity_value_t v2;
  
  obj = v.field_1;
  if (f->tag != EXEC_TYPE_NATIVE) {
    __assert_fail("f->tag == EXEC_TYPE_NATIVE",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                  ,0x20e,
                  "uint16_t gravity_function_cpool_add(gravity_vm *, gravity_function_t *, gravity_value_t)"
                 );
  }
  sVar3 = (f->field_9).field_0.cpool.n;
  if (sVar3 != 0) {
    lVar5 = 8;
    sVar4 = 0;
    do {
      pvVar2 = (f->field_9).field_2.special[1];
      v2.field_1.n = ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)pvVar2 + lVar5))->n;
      v2.isa = *(gravity_class_t **)((long)pvVar2 + lVar5 + -8);
      _Var1 = gravity_value_equals(v,v2);
      if (_Var1) {
        _Var1 = gravity_value_isobject(v);
        if (_Var1) {
          gravity_object_free((gravity_vm *)0x0,obj.p);
        }
        goto LAB_0012bb2c;
      }
      sVar4 = sVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (sVar3 != sVar4);
  }
  if (vm != (gravity_vm *)0x0) {
    _Var1 = gravity_value_isobject(v);
    if (_Var1) {
      gravity_vm_transfer(vm,obj.p);
    }
  }
  sVar3 = (f->field_9).field_0.cpool.n;
  if (sVar3 == (f->field_9).field_0.cpool.m) {
    sVar4 = 8;
    if (sVar3 != 0) {
      sVar4 = sVar3 * 2;
    }
    (f->field_9).field_0.cpool.m = sVar4;
    pvVar2 = realloc((f->field_9).field_2.special[1],sVar4 << 4);
    (f->field_9).field_2.special[1] = pvVar2;
    sVar3 = (f->field_9).field_0.cpool.n;
  }
  else {
    pvVar2 = (f->field_9).field_2.special[1];
  }
  (f->field_9).internal = (gravity_c_internal)(sVar3 + 1);
  *(gravity_class_t **)((long)pvVar2 + sVar3 * 0x10) = v.isa;
  ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)pvVar2 + sVar3 * 0x10 + 8))->p =
       (gravity_object_t *)obj;
  sVar4 = (size_t)(*(int *)&f->field_9 - 1);
LAB_0012bb2c:
  return (uint16_t)sVar4;
}

Assistant:

uint16_t gravity_function_cpool_add (gravity_vm *vm, gravity_function_t *f, gravity_value_t v) {
    assert(f->tag == EXEC_TYPE_NATIVE);

    size_t n = marray_size(f->cpool);
    for (size_t i=0; i<n; i++) {
        gravity_value_t v2 = marray_get(f->cpool, i);
        if (gravity_value_equals(v,v2)) {
            gravity_value_free(NULL, v);
            return (uint16_t)i;
        }
    }

    // vm is required here because I cannot know in advance if v is already in the pool or not
    // and value object v must be added to the VM only once
    if ((vm) && (gravity_value_isobject(v))) gravity_vm_transfer(vm, VALUE_AS_OBJECT(v));

    marray_push(gravity_value_t, f->cpool, v);
    return (uint16_t)marray_size(f->cpool)-1;
}